

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::CIBuildOnlyReporter::report
          (CIBuildOnlyReporter *this,string *received,string *approved)

{
  bool bVar1;
  element_type *peVar2;
  string *in_RDX;
  string *in_RSI;
  string local_60 [32];
  string local_40 [64];
  
  bVar1 = isRunningUnderCI();
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1618c7);
    ::std::__cxx11::string::string(local_40,in_RSI);
    ::std::__cxx11::string::string(local_60,in_RDX);
    (*peVar2->_vptr_Reporter[2])(peVar2,local_40,local_60);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string(local_40);
  }
  return bVar1;
}

Assistant:

bool CIBuildOnlyReporter::report(std::string received, std::string approved) const
    {
        if (!isRunningUnderCI())
        {
            return false;
        }
        m_reporter->report(received, approved);
        // Return true regardless of whether our report succeeded or not,
        // so that no later reporters run.
        return true;
    }